

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O0

void indigox::algorithm::QuickBBOrder(PermutableGraph_p *G,ElimOrder *order)

{
  ostream *this;
  shared_ptr<indigox::PermutableGraph> *in_RDI;
  ElimOrder *in_stack_00002718;
  PermutableGraph_p *in_stack_00002720;
  shared_ptr<indigox::PermutableGraph> *in_stack_ffffffffffffffb8;
  
  std::vector<void_*,_std::allocator<void_*>_>::clear
            ((vector<void_*,_std::allocator<void_*>_> *)0x19a99d);
  this = std::operator<<((ostream *)&std::cout,
                         "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles."
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<indigox::PermutableGraph>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  RandomOrder(in_stack_00002720,in_stack_00002718);
  std::shared_ptr<indigox::PermutableGraph>::~shared_ptr
            ((shared_ptr<indigox::PermutableGraph> *)0x19a9ee);
  return;
}

Assistant:

void QuickBBOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
#ifndef BUILD_JAVA
      std::cout << "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles." << std::endl;
      RandomOrder(G, order);
#else
      String DGFString = G->ToDGFString();
      String EO = utils::GetEliminationOrdering(DGFString);
      
      std::istringstream ss(EO);
      String idx;
      while (std::getline(ss, idx, ' ')) {
        indigox::uid_t i = (indigox::uid_t)std::stoull(idx);
        order.push_back(G->GetVertexByIndex(i).first);
      }
      
#endif
    }